

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

string * wasm::read_possible_response_file(string *__return_storage_ptr__,string *input)

{
  long lVar1;
  char *pcVar2;
  BinaryOption binary;
  wasm local_38 [32];
  string *local_18;
  string *input_local;
  
  local_18 = input;
  input_local = __return_storage_ptr__;
  lVar1 = std::__cxx11::string::size();
  if ((lVar1 != 0) &&
     (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18), *pcVar2 == '@')) {
    binary = ~Binary;
    std::__cxx11::string::substr((ulong)local_38,(ulong)local_18);
    read_file<std::__cxx11::string>(__return_storage_ptr__,local_38,(string *)0x1,binary);
    std::__cxx11::string::~string((string *)local_38);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_18);
  return __return_storage_ptr__;
}

Assistant:

std::string wasm::read_possible_response_file(const std::string& input) {
  if (input.size() == 0 || input[0] != '@') {
    return input;
  }
  return wasm::read_file<std::string>(input.substr(1), Flags::Text);
}